

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_xml.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  XmlWriter *this_00;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  LazyStat<Catch::GroupInfo>::operator=
            (&(this->super_StreamingReporterBase).currentGroupInfo,groupInfo);
  std::__cxx11::string::string((string *)&local_38,"Group",&local_59);
  this_00 = XmlWriter::startElement(&this->m_xml,&local_38);
  std::__cxx11::string::string((string *)&local_58,"name",&local_5a);
  XmlWriter::writeAttribute(this_00,&local_58,&groupInfo->name);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& groupInfo ) {
            StreamingReporterBase::testGroupStarting( groupInfo );
            m_xml.startElement( "Group" )
                .writeAttribute( "name", groupInfo.name );
        }